

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Sym * next_D_Sym_in_Scope(D_Scope **scope,D_Sym **sym)

{
  D_SymHash *pDVar1;
  D_Scope *pDVar2;
  D_Sym *pDVar3;
  D_Sym **ppDVar4;
  uint uVar5;
  D_Scope *pDVar6;
  D_Sym *pDVar7;
  
  pDVar7 = *sym;
  pDVar6 = *scope;
  if ((pDVar7 == (D_Sym *)0x0) || (pDVar3 = pDVar7->next, pDVar3 == (D_Sym *)0x0)) {
    pDVar2 = pDVar6;
    while (pDVar6 = pDVar2, pDVar6 != (D_Scope *)0x0) {
      pDVar1 = pDVar6->hash;
      if (pDVar1 == (D_SymHash *)0x0) {
        if (pDVar7 == (D_Sym *)0x0) {
          ppDVar4 = &pDVar6->ll;
          goto LAB_00149ce7;
        }
LAB_00149cd9:
        pDVar3 = (D_Sym *)0x0;
      }
      else {
        if (pDVar7 == (D_Sym *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (pDVar7->hash + 1) % (pDVar1->syms).n;
          if (uVar5 == 0) goto LAB_00149cd9;
        }
        ppDVar4 = (pDVar1->syms).v + uVar5;
LAB_00149ce7:
        pDVar3 = *ppDVar4;
      }
      if (((pDVar3 != (D_Sym *)0x0) ||
          (pDVar2 = pDVar6->search, pDVar3 = (D_Sym *)0x0, pDVar2 == (D_Scope *)0x0)) ||
         (pDVar7 = (D_Sym *)0x0, pDVar2->up != pDVar6->up)) goto LAB_00149d12;
    }
    pDVar6 = (D_Scope *)0x0;
    pDVar3 = (D_Sym *)0x0;
  }
LAB_00149d12:
  if (pDVar3 != (D_Sym *)0x0) {
    *sym = pDVar3;
  }
  *scope = pDVar6;
  return pDVar3;
}

Assistant:

D_Sym *next_D_Sym_in_Scope(D_Scope **scope, D_Sym **sym) {
  D_Sym *last_sym = *sym, *ll = last_sym;
  D_Scope *st = *scope;
  if (ll) {
    ll = ll->next;
    if (ll) goto Lreturn;
  }
  for (; st; st = st->search) {
    if (st->hash) {
      uint i = last_sym ? ((last_sym->hash + 1) % st->hash->syms.n) : 0;
      if (!last_sym || i) ll = st->hash->syms.v[i];
    } else {
      if (!last_sym) ll = st->ll;
    }
    last_sym = 0;
    if (ll) goto Lreturn;
    if (!st->search || st->search->up != st->up) break;
  }
Lreturn:
  if (ll) *sym = ll;
  *scope = st;
  return ll;
}